

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_tex_coords_portable_predictor.h
# Opt level: O1

bool __thiscall
draco::
MeshPredictionSchemeTexCoordsPortablePredictor<int,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
::ComputePredictedValue<false>
          (MeshPredictionSchemeTexCoordsPortablePredictor<int,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
           *this,CornerIndex corner_id,int *data,int data_id)

{
  int entry_id;
  int iVar1;
  int iVar2;
  CornerTable *pCVar3;
  vector<int,_std::allocator<int>_> *pvVar4;
  pointer piVar5;
  _Bit_type *p_Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int i;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  CornerIndex CVar14;
  ulong uVar15;
  ulong uVar16;
  byte bVar17;
  MeshPredictionSchemeTexCoordsPortablePredictor<int,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
  *pMVar18;
  Scalar_conflict ret_1;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  bool bVar22;
  bool bVar23;
  ulong uVar24;
  ulong uVar29;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar30 [16];
  long lVar31;
  long lVar32;
  Self ret_5;
  Vec3 pn;
  Self ret_4;
  Vec3 x_pos;
  Vec3 cn;
  Vec3 next_pos;
  Vec3 tip_pos;
  Vec3 prev_pos;
  undefined1 local_158 [16];
  undefined8 local_148;
  undefined1 local_138 [16];
  ulong local_128;
  int *local_120;
  ulong local_118;
  ulong uStack_110;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  VectorD<long,_3> local_b0;
  long local_98;
  long lStack_90;
  long local_88 [5];
  VectorD<long,_3> local_60;
  VectorD<long,_3> local_48;
  uint uVar27;
  uint uVar28;
  
  CVar14.value_ = corner_id.value_;
  if (corner_id.value_ != 0xffffffff) {
    CVar14.value_ = corner_id.value_ - 2;
    if (0x55555555 < (corner_id.value_ + 1) * -0x55555555) {
      CVar14.value_ = corner_id.value_ + 1;
    }
  }
  if (corner_id.value_ != 0xffffffff) {
    corner_id.value_ = ((corner_id.value_ * -0x55555555 < 0x55555556) - 1 | 2) + corner_id.value_;
  }
  pCVar3 = (this->mesh_data_).corner_table_;
  uVar10 = 0xffffffffffffffff;
  uVar11 = 0xffffffffffffffff;
  if (CVar14.value_ != 0xffffffff) {
    uVar11 = (ulong)(int)(pCVar3->corner_to_vertex_map_).vector_.
                         super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[CVar14.value_].value_;
  }
  if (corner_id.value_ != 0xffffffff) {
    uVar10 = (ulong)(int)(pCVar3->corner_to_vertex_map_).vector_.
                         super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[corner_id.value_].value_;
  }
  pvVar4 = (this->mesh_data_).vertex_to_data_map_;
  piVar5 = (pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar15 = (long)(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
  uVar19 = uVar11;
  if ((uVar15 <= uVar11) || (uVar19 = uVar10, uVar15 <= uVar10)) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar19);
  }
  iVar21 = piVar5[uVar11];
  entry_id = piVar5[uVar10];
  if ((entry_id < data_id) && (iVar21 < data_id)) {
    uVar10 = (ulong)data[(long)iVar21 * 2];
    uVar11 = (ulong)data[iVar21 * 2 + 1];
    iVar1 = data[(long)entry_id * 2];
    local_98 = (long)iVar1;
    iVar2 = data[entry_id * 2 + 1];
    lStack_90 = (long)iVar2;
    if (data[(long)iVar21 * 2] == iVar1) {
      bVar22 = false;
      do {
        bVar23 = bVar22;
        if (bVar23) goto LAB_001502d0;
        bVar22 = true;
      } while (iVar2 == data[iVar21 * 2 + 1]);
      if (!bVar23) goto LAB_001502e0;
LAB_001502d0:
      this->predicted_value_[0] = iVar1;
      this->predicted_value_[1] = iVar2;
      bVar17 = 1;
      bVar22 = false;
    }
    else {
LAB_001502e0:
      local_120 = data;
      local_118 = uVar10;
      uStack_110 = uVar11;
      GetPositionForEntryId(&local_60,this,data_id);
      GetPositionForEntryId(&local_b0,this,iVar21);
      pMVar18 = this;
      GetPositionForEntryId(&local_48,this,entry_id);
      bVar17 = (byte)pMVar18;
      local_138 = (undefined1  [16])0x0;
      local_128 = 0;
      lVar13 = 0;
      do {
        *(long *)(local_138 + lVar13 * 8) =
             local_48.v_._M_elems[lVar13] - local_b0.v_._M_elems[lVar13];
        lVar13 = lVar13 + 1;
      } while (lVar13 != 3);
      lVar13 = 0;
      uVar19 = 0;
      do {
        uVar19 = uVar19 + *(long *)(local_138 + lVar13 * 8) * *(long *)(local_138 + lVar13 * 8);
        lVar13 = lVar13 + 1;
      } while (lVar13 != 3);
      bVar22 = uVar19 == 0;
      data = local_120;
      if (!bVar22) {
        local_c8 = (undefined1  [16])0x0;
        local_b8 = 0;
        lVar13 = 0;
        do {
          *(long *)(local_c8 + lVar13 * 8) =
               local_60.v_._M_elems[lVar13] - local_b0.v_._M_elems[lVar13];
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        lVar13 = 0;
        uVar15 = 0;
        do {
          uVar15 = uVar15 + *(long *)(local_c8 + lVar13 * 8) * *(long *)(local_138 + lVar13 * 8);
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        uVar24 = -uVar10;
        if (0 < (long)uVar10) {
          uVar24 = uVar10;
        }
        uVar10 = -uVar11;
        if (0 < (long)uVar11) {
          uVar10 = uVar11;
        }
        if (uVar10 < uVar24) {
          uVar10 = uVar24;
        }
        bVar17 = 0;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = uVar19;
        if (uVar10 <= SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar7,0)) {
          uVar24 = local_98 - local_118;
          uVar29 = lStack_90 - uStack_110;
          uVar11 = -uVar24;
          uVar10 = uVar24;
          if ((long)uVar24 < 1) {
            uVar10 = uVar11;
          }
          uVar20 = -uVar29;
          if (0 < (long)uVar29) {
            uVar20 = uVar29;
          }
          if (uVar20 < uVar10) {
            uVar20 = uVar10;
          }
          bVar17 = 0;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = uVar20;
          if ((long)uVar15 <= SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar8,0))
          {
            uVar10 = -local_138._0_8_;
            if (0 < (long)local_138._0_8_) {
              uVar10 = local_138._0_8_;
            }
            uVar20 = -local_138._8_8_;
            if (0 < (long)local_138._8_8_) {
              uVar20 = local_138._8_8_;
            }
            uVar16 = -local_128;
            if (0 < (long)local_128) {
              uVar16 = local_128;
            }
            if (uVar20 < uVar10) {
              uVar20 = uVar10;
            }
            if (uVar20 <= uVar16) {
              uVar20 = uVar16;
            }
            bVar17 = 0;
            auVar9._8_8_ = 0;
            auVar9._0_8_ = uVar20;
            if ((long)uVar15 <=
                SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar9,0)) {
              uVar27 = (uint)(uVar19 >> 0x20);
              auVar25._8_4_ = (int)uVar19;
              auVar25._0_8_ = uVar19;
              auVar25._12_4_ = uVar27;
              uVar28 = (uint)(uVar15 >> 0x20);
              auVar26._8_4_ = (int)uVar15;
              auVar26._0_8_ = uVar15;
              auVar26._12_4_ = uVar28;
              lVar31 = (uVar24 & 0xffffffff) * (uVar15 & 0xffffffff) +
                       (local_118 & 0xffffffff) * (uVar19 & 0xffffffff) +
                       ((ulong)uVar27 * (local_118 & 0xffffffff) +
                        (local_118 >> 0x20) * (uVar19 & 0xffffffff) << 0x20) +
                       ((ulong)uVar28 * (uVar24 & 0xffffffff) +
                        (uVar24 >> 0x20) * (uVar15 & 0xffffffff) << 0x20);
              lVar32 = (uVar29 & 0xffffffff) * (uVar15 & 0xffffffff) +
                       (uStack_110 & 0xffffffff) * (uVar19 & 0xffffffff) +
                       ((auVar25._8_8_ >> 0x20) * (uStack_110 & 0xffffffff) +
                        (uStack_110 >> 0x20) * (uVar19 & 0xffffffff) << 0x20) +
                       ((auVar26._8_8_ >> 0x20) * (uVar29 & 0xffffffff) +
                        (uVar29 >> 0x20) * (uVar15 & 0xffffffff) << 0x20);
              local_108 = (undefined1  [16])0x0;
              local_f8 = 0;
              lVar13 = 0;
              do {
                *(ulong *)(local_108 + lVar13 * 8) = *(long *)(local_138 + lVar13 * 8) * uVar15;
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              local_158 = (undefined1  [16])0x0;
              local_148 = 0;
              lVar13 = 0;
              do {
                *(long *)(local_158 + lVar13 * 8) = *(long *)(local_108 + lVar13 * 8) / (long)uVar19
                ;
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              local_e8 = (undefined1  [16])0x0;
              local_d8 = 0;
              lVar13 = 0;
              do {
                *(long *)(local_e8 + lVar13 * 8) =
                     *(long *)(local_158 + lVar13 * 8) + local_b0.v_._M_elems[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              local_158 = (undefined1  [16])0x0;
              local_148 = 0;
              lVar13 = 0;
              do {
                *(long *)(local_158 + lVar13 * 8) =
                     local_60.v_._M_elems[lVar13] - *(long *)(local_e8 + lVar13 * 8);
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              lVar13 = 0;
              lVar12 = 0;
              do {
                lVar12 = lVar12 + *(long *)(local_158 + lVar13 * 8) *
                                  *(long *)(local_158 + lVar13 * 8);
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              uVar10 = lVar12 * uVar19;
              if (uVar10 == 0) {
                uVar15 = 0;
              }
              else {
                uVar15 = uVar10;
                if (uVar10 != 1) {
                  uVar15 = 1;
                  uVar24 = uVar10;
                  do {
                    uVar15 = uVar15 * 2;
                    bVar23 = 7 < uVar24;
                    uVar24 = uVar24 >> 2;
                  } while (bVar23);
                }
                do {
                  uVar15 = uVar10 / uVar15 + uVar15 >> 1;
                } while (uVar10 <= uVar15 * uVar15 && uVar15 * uVar15 - uVar10 != 0);
              }
              p_Var6 = (this->orientations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
              uVar27 = (this->orientations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
              bVar23 = (this->orientations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != p_Var6;
              bVar17 = uVar27 != 0 || bVar23;
              if (uVar27 != 0 || bVar23) {
                uVar28 = (uint)(uVar15 >> 0x20);
                auVar30._8_4_ = (int)uVar15;
                auVar30._0_8_ = uVar15;
                auVar30._12_4_ = uVar28;
                uVar10 = (ulong)uVar27 - 1;
                uVar24 = (ulong)uVar27 + 0x3e;
                if (-1 < (long)uVar10) {
                  uVar24 = uVar10;
                }
                uVar24 = p_Var6[((long)uVar24 >> 6) +
                                ((ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001) - 1)];
                (this->orientations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = uVar27 - 1;
                if (uVar27 == 0) {
                  (this->orientations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0x3f;
                  (this->orientations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = p_Var6 + -1;
                }
                lVar13 = (uVar29 & 0xffffffff) * (uVar15 & 0xffffffff) +
                         ((ulong)uVar28 * (uVar29 & 0xffffffff) +
                          (uVar29 >> 0x20) * (uVar15 & 0xffffffff) << 0x20);
                lVar12 = (uVar11 & 0xffffffff) * (uVar15 & 0xffffffff) +
                         ((auVar30._8_8_ >> 0x20) * (uVar11 & 0xffffffff) +
                          (uVar11 >> 0x20) * (uVar15 & 0xffffffff) << 0x20);
                if ((1L << ((byte)uVar10 & 0x3f) & uVar24) == 0) {
                  local_88[0] = lVar31 - lVar13;
                  local_88[1] = lVar32 - lVar12;
                  local_158 = (undefined1  [16])0x0;
                  lVar13 = 0;
                  do {
                    *(long *)(local_158 + lVar13 * 8) = local_88[lVar13] / (long)uVar19;
                    lVar13 = lVar13 + 1;
                  } while (lVar13 == 1);
                }
                else {
                  local_88[2] = lVar13 + lVar31;
                  local_88[3] = lVar12 + lVar32;
                  local_158 = (undefined1  [16])0x0;
                  lVar13 = 0;
                  do {
                    *(long *)(local_158 + lVar13 * 8) = local_88[lVar13 + 2] / (long)uVar19;
                    lVar13 = lVar13 + 1;
                  } while (lVar13 == 1);
                }
                *(ulong *)this->predicted_value_ = CONCAT44(local_158._8_4_,local_158._0_4_);
              }
            }
          }
        }
      }
    }
    if (!bVar22) goto LAB_001506b2;
  }
  if (iVar21 < data_id) {
    iVar21 = iVar21 * 2;
LAB_00150696:
    lVar13 = 0;
    do {
      this->predicted_value_[lVar13] = data[iVar21 + lVar13];
      lVar13 = lVar13 + 1;
    } while (lVar13 == 1);
  }
  else {
    if (0 < data_id) {
      iVar21 = data_id * 2 + -2;
      goto LAB_00150696;
    }
    this->predicted_value_[0] = 0;
    this->predicted_value_[1] = 0;
  }
  bVar17 = 1;
LAB_001506b2:
  return (bool)(bVar17 & 1);
}

Assistant:

bool MeshPredictionSchemeTexCoordsPortablePredictor<
    DataTypeT, MeshDataT>::ComputePredictedValue(CornerIndex corner_id,
                                                 const DataTypeT *data,
                                                 int data_id) {
  // Compute the predicted UV coordinate from the positions on all corners
  // of the processed triangle. For the best prediction, the UV coordinates
  // on the next/previous corners need to be already encoded/decoded.
  const CornerIndex next_corner_id = mesh_data_.corner_table()->Next(corner_id);
  const CornerIndex prev_corner_id =
      mesh_data_.corner_table()->Previous(corner_id);
  // Get the encoded data ids from the next and previous corners.
  // The data id is the encoding order of the UV coordinates.
  int next_data_id, prev_data_id;

  int next_vert_id, prev_vert_id;
  next_vert_id = mesh_data_.corner_table()->Vertex(next_corner_id).value();
  prev_vert_id = mesh_data_.corner_table()->Vertex(prev_corner_id).value();

  next_data_id = mesh_data_.vertex_to_data_map()->at(next_vert_id);
  prev_data_id = mesh_data_.vertex_to_data_map()->at(prev_vert_id);

  typedef VectorD<int64_t, 2> Vec2;
  typedef VectorD<int64_t, 3> Vec3;
  typedef VectorD<uint64_t, 2> Vec2u;

  if (prev_data_id < data_id && next_data_id < data_id) {
    // Both other corners have available UV coordinates for prediction.
    const Vec2 n_uv = GetTexCoordForEntryId(next_data_id, data);
    const Vec2 p_uv = GetTexCoordForEntryId(prev_data_id, data);
    if (p_uv == n_uv) {
      // We cannot do a reliable prediction on degenerated UV triangles.
      predicted_value_[0] = p_uv[0];
      predicted_value_[1] = p_uv[1];
      return true;
    }

    // Get positions at all corners.
    const Vec3 tip_pos = GetPositionForEntryId(data_id);
    const Vec3 next_pos = GetPositionForEntryId(next_data_id);
    const Vec3 prev_pos = GetPositionForEntryId(prev_data_id);
    // We use the positions of the above triangle to predict the texture
    // coordinate on the tip corner C.
    // To convert the triangle into the UV coordinate system we first compute
    // position X on the vector |prev_pos - next_pos| that is the projection of
    // point C onto vector |prev_pos - next_pos|:
    //
    //              C
    //             /.  \
    //            / .     \
    //           /  .        \
    //          N---X----------P
    //
    // Where next_pos is point (N), prev_pos is point (P) and tip_pos is the
    // position of predicted coordinate (C).
    //
    const Vec3 pn = prev_pos - next_pos;
    const uint64_t pn_norm2_squared = pn.SquaredNorm();
    if (pn_norm2_squared != 0) {
      // Compute the projection of C onto PN by computing dot product of CN with
      // PN and normalizing it by length of PN. This gives us a factor |s| where
      // |s = PN.Dot(CN) / PN.SquaredNorm2()|. This factor can be used to
      // compute X in UV space |X_UV| as |X_UV = N_UV + s * PN_UV|.
      const Vec3 cn = tip_pos - next_pos;
      const int64_t cn_dot_pn = pn.Dot(cn);

      const Vec2 pn_uv = p_uv - n_uv;
      // Because we perform all computations with integers, we don't explicitly
      // compute the normalized factor |s|, but rather we perform all operations
      // over UV vectors in a non-normalized coordinate system scaled with a
      // scaling factor |pn_norm2_squared|:
      //
      //      x_uv = X_UV * PN.Norm2Squared()
      //
      const int64_t n_uv_absmax_element =
          std::max(std::abs(n_uv[0]), std::abs(n_uv[1]));
      if (n_uv_absmax_element >
          std::numeric_limits<int64_t>::max() / pn_norm2_squared) {
        // Return false if the below multiplication would overflow.
        return false;
      }
      const int64_t pn_uv_absmax_element =
          std::max(std::abs(pn_uv[0]), std::abs(pn_uv[1]));
      if (cn_dot_pn >
          std::numeric_limits<int64_t>::max() / pn_uv_absmax_element) {
        // Return false if squared length calculation would overflow.
        return false;
      }
      const Vec2 x_uv = n_uv * pn_norm2_squared + (cn_dot_pn * pn_uv);
      const int64_t pn_absmax_element =
          std::max(std::max(std::abs(pn[0]), std::abs(pn[1])), std::abs(pn[2]));
      if (cn_dot_pn > std::numeric_limits<int64_t>::max() / pn_absmax_element) {
        // Return false if squared length calculation would overflow.
        return false;
      }

      // Compute squared length of vector CX in position coordinate system:
      const Vec3 x_pos = next_pos + (cn_dot_pn * pn) / pn_norm2_squared;
      const uint64_t cx_norm2_squared = (tip_pos - x_pos).SquaredNorm();

      // Compute vector CX_UV in the uv space by rotating vector PN_UV by 90
      // degrees and scaling it with factor CX.Norm2() / PN.Norm2():
      //
      //     CX_UV = (CX.Norm2() / PN.Norm2()) * Rot(PN_UV)
      //
      // To preserve precision, we perform all operations in scaled space as
      // explained above, so we want the final vector to be:
      //
      //     cx_uv = CX_UV * PN.Norm2Squared()
      //
      // We can then rewrite the formula as:
      //
      //     cx_uv = CX.Norm2() * PN.Norm2() * Rot(PN_UV)
      //
      Vec2 cx_uv(pn_uv[1], -pn_uv[0]);  // Rotated PN_UV.
      // Compute CX.Norm2() * PN.Norm2()
      const uint64_t norm_squared =
          IntSqrt(cx_norm2_squared * pn_norm2_squared);
      // Final cx_uv in the scaled coordinate space.
      cx_uv = cx_uv * norm_squared;

      // Predicted uv coordinate is then computed by either adding or
      // subtracting CX_UV to/from X_UV.
      Vec2 predicted_uv;
      if (is_encoder_t) {
        // When encoding, compute both possible vectors and determine which one
        // results in a better prediction.
        // Both vectors need to be transformed back from the scaled space to
        // the real UV coordinate space.
        const Vec2 predicted_uv_0((x_uv + cx_uv) / pn_norm2_squared);
        const Vec2 predicted_uv_1((x_uv - cx_uv) / pn_norm2_squared);
        const Vec2 c_uv = GetTexCoordForEntryId(data_id, data);
        if ((c_uv - predicted_uv_0).SquaredNorm() <
            (c_uv - predicted_uv_1).SquaredNorm()) {
          predicted_uv = predicted_uv_0;
          orientations_.push_back(true);
        } else {
          predicted_uv = predicted_uv_1;
          orientations_.push_back(false);
        }
      } else {
        // When decoding the data, we already know which orientation to use.
        if (orientations_.empty()) {
          return false;
        }
        const bool orientation = orientations_.back();
        orientations_.pop_back();
        // Perform operations in unsigned type to avoid signed integer overflow.
        // Note that the result will be the same (for non-overflowing values).
        if (orientation) {
          predicted_uv = Vec2(Vec2u(x_uv) + Vec2u(cx_uv)) / pn_norm2_squared;
        } else {
          predicted_uv = Vec2(Vec2u(x_uv) - Vec2u(cx_uv)) / pn_norm2_squared;
        }
      }
      predicted_value_[0] = static_cast<int>(predicted_uv[0]);
      predicted_value_[1] = static_cast<int>(predicted_uv[1]);
      return true;
    }
  }
  // Else we don't have available textures on both corners or the position data
  // is invalid. For such cases we can't use positions for predicting the uv
  // value and we resort to delta coding.
  int data_offset = 0;
  if (prev_data_id < data_id) {
    // Use the value on the previous corner as the prediction.
    data_offset = prev_data_id * kNumComponents;
  }
  if (next_data_id < data_id) {
    // Use the value on the next corner as the prediction.
    data_offset = next_data_id * kNumComponents;
  } else {
    // None of the other corners have a valid value. Use the last encoded value
    // as the prediction if possible.
    if (data_id > 0) {
      data_offset = (data_id - 1) * kNumComponents;
    } else {
      // We are encoding the first value. Predict 0.
      for (int i = 0; i < kNumComponents; ++i) {
        predicted_value_[i] = 0;
      }
      return true;
    }
  }
  for (int i = 0; i < kNumComponents; ++i) {
    predicted_value_[i] = data[data_offset + i];
  }
  return true;
}